

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault::SharedDtor(MessageLite *self)

{
  FeatureSet *pFVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  FeatureSetDefaults_FeatureSetEditionDefault *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (FeatureSetDefaults_FeatureSetEditionDefault *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar2 = MessageLite::GetArena(local_18);
  if (pAVar2 == (Arena *)0x0) {
    pFVar1 = (FeatureSet *)local_18[1]._internal_metadata_.ptr_;
    if (pFVar1 != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(pFVar1);
      operator_delete(pFVar1,0x50);
    }
    pFVar1 = (FeatureSet *)local_18[2]._vptr_MessageLite;
    if (pFVar1 != (FeatureSet *)0x0) {
      FeatureSet::~FeatureSet(pFVar1);
      operator_delete(pFVar1,0x50);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x35f0,"this_.GetArena() == nullptr");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void FeatureSetDefaults_FeatureSetEditionDefault::SharedDtor(MessageLite& self) {
  FeatureSetDefaults_FeatureSetEditionDefault& this_ = static_cast<FeatureSetDefaults_FeatureSetEditionDefault&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.overridable_features_;
  delete this_._impl_.fixed_features_;
  this_._impl_.~Impl_();
}